

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigObj.c
# Opt level: O3

void Aig_ObjConnect(Aig_Man_t *p,Aig_Obj_t *pObj,Aig_Obj_t *pFan0,Aig_Obj_t *pFan1)

{
  ulong uVar1;
  uint uVar2;
  uint uVar3;
  ulong uVar4;
  Aig_Obj_t *pAVar5;
  
  if (((ulong)pObj & 1) != 0) {
    __assert_fail("!Aig_IsComplement(pObj)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/aig/aigObj.c"
                  ,0x80,"void Aig_ObjConnect(Aig_Man_t *, Aig_Obj_t *, Aig_Obj_t *, Aig_Obj_t *)");
  }
  if ((*(uint *)&pObj->field_0x18 & 7) == 2) {
    __assert_fail("!Aig_ObjIsCi(pObj)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/aig/aigObj.c"
                  ,0x81,"void Aig_ObjConnect(Aig_Man_t *, Aig_Obj_t *, Aig_Obj_t *, Aig_Obj_t *)");
  }
  pObj->pFanin0 = pFan0;
  pObj->pFanin1 = pFan1;
  if (pFan0 != (Aig_Obj_t *)0x0) {
    uVar1 = *(ulong *)(((ulong)pFan0 & 0xfffffffffffffffe) + 0x18);
    if ((uVar1 & 7) == 0) {
      __assert_fail("Aig_ObjFanin0(pObj)->Type > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/aig/aigObj.c"
                    ,0x88,"void Aig_ObjConnect(Aig_Man_t *, Aig_Obj_t *, Aig_Obj_t *, Aig_Obj_t *)")
      ;
    }
    *(ulong *)(((ulong)pFan0 & 0xfffffffffffffffe) + 0x18) =
         uVar1 & 0xffffffff0000003f | (ulong)((int)uVar1 + 0x40U & 0xffffffc0);
    if (p->pFanData != (int *)0x0) {
      Aig_ObjAddFanout(p,(Aig_Obj_t *)((ulong)pObj->pFanin0 & 0xfffffffffffffffe),pObj);
    }
  }
  pAVar5 = pObj->pFanin1;
  if (pFan1 != (Aig_Obj_t *)0x0) {
    uVar1 = *(ulong *)(((ulong)pAVar5 & 0xfffffffffffffffe) + 0x18);
    if ((uVar1 & 7) == 0) {
      __assert_fail("Aig_ObjFanin1(pObj)->Type > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/aig/aigObj.c"
                    ,0x8f,"void Aig_ObjConnect(Aig_Man_t *, Aig_Obj_t *, Aig_Obj_t *, Aig_Obj_t *)")
      ;
    }
    *(ulong *)(((ulong)pAVar5 & 0xfffffffffffffffe) + 0x18) =
         uVar1 & 0xffffffff0000003f | (ulong)((int)uVar1 + 0x40U & 0xffffffc0);
    pAVar5 = pObj->pFanin1;
    if (p->pFanData != (int *)0x0) {
      Aig_ObjAddFanout(p,(Aig_Obj_t *)((ulong)pAVar5 & 0xfffffffffffffffe),pObj);
      pAVar5 = pObj->pFanin1;
    }
  }
  if (((ulong)pAVar5 & 0xfffffffffffffffe) == 0) {
    uVar1 = *(ulong *)&pObj->field_0x18;
    uVar3 = *(uint *)(((ulong)pObj->pFanin0 & 0xfffffffffffffffe) + 0x1c);
  }
  else {
    uVar1 = *(ulong *)&pObj->field_0x18;
    uVar2 = *(uint *)(((ulong)pObj->pFanin0 & 0xfffffffffffffffe) + 0x1c) & 0xffffff;
    uVar3 = *(uint *)(((ulong)pAVar5 & 0xfffffffffffffffe) + 0x1c) & 0xffffff;
    if (uVar3 < uVar2) {
      uVar3 = uVar2;
    }
    uVar3 = uVar3 + (((uint)uVar1 & 7) == 6) + 1;
  }
  uVar4 = (ulong)(uVar3 & 0xffffff) << 0x20;
  *(ulong *)&pObj->field_0x18 = uVar1 & 0xff000000ffffffff | uVar4;
  uVar3 = 1;
  uVar2 = 1;
  if (pFan0 != (Aig_Obj_t *)0x0) {
    uVar2 = ((uint)pFan0 ^ *(uint *)(((ulong)pFan0 & 0xfffffffffffffffe) + 0x18) >> 3) & 1;
  }
  if (pFan1 != (Aig_Obj_t *)0x0) {
    uVar3 = (uint)pFan1 ^ *(uint *)(((ulong)pFan1 & 0xfffffffffffffffe) + 0x18) >> 3;
  }
  uVar4 = (uVar1 & 0xff000000fffffff7 | uVar4) + (ulong)(uVar3 & uVar2) * 8;
  *(ulong *)&pObj->field_0x18 = uVar4;
  if ((p->pTable != (Aig_Obj_t **)0x0) && (0xfffffffd < ((uint)uVar1 & 7) - 7)) {
    Aig_TableInsert(p,pObj);
    uVar4 = *(ulong *)&pObj->field_0x18;
  }
  if (((uVar4 & 0xffffff00000000) == 0) && (((uint)uVar4 & 7) - 5 < 2)) {
    __assert_fail("!Aig_ObjIsNode(pObj) || pObj->Level > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/aig/aigObj.c"
                  ,0x9d,"void Aig_ObjConnect(Aig_Man_t *, Aig_Obj_t *, Aig_Obj_t *, Aig_Obj_t *)");
  }
  return;
}

Assistant:

void Aig_ObjConnect( Aig_Man_t * p, Aig_Obj_t * pObj, Aig_Obj_t * pFan0, Aig_Obj_t * pFan1 )
{
    assert( !Aig_IsComplement(pObj) );
    assert( !Aig_ObjIsCi(pObj) );
    // add the first fanin
    pObj->pFanin0 = pFan0;
    pObj->pFanin1 = pFan1;
    // increment references of the fanins and add their fanouts
    if ( pFan0 != NULL )
    {
        assert( Aig_ObjFanin0(pObj)->Type > 0 );
        Aig_ObjRef( Aig_ObjFanin0(pObj) );
        if ( p->pFanData )
            Aig_ObjAddFanout( p, Aig_ObjFanin0(pObj), pObj );
    }
    if ( pFan1 != NULL )
    {
        assert( Aig_ObjFanin1(pObj)->Type > 0 );
        Aig_ObjRef( Aig_ObjFanin1(pObj) );
        if ( p->pFanData )
            Aig_ObjAddFanout( p, Aig_ObjFanin1(pObj), pObj );
    }
    // set level and phase
    pObj->Level = Aig_ObjLevelNew( pObj );
    pObj->fPhase = Aig_ObjPhaseReal(pFan0) & Aig_ObjPhaseReal(pFan1);
    // add the node to the structural hash table
    if ( p->pTable && Aig_ObjIsHash(pObj) )
        Aig_TableInsert( p, pObj );
    // add the node to the dynamically updated topological order
//    if ( p->pOrderData && Aig_ObjIsNode(pObj) )
//        Aig_ObjOrderInsert( p, pObj->Id );
    assert( !Aig_ObjIsNode(pObj) || pObj->Level > 0 );
}